

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O2

void __thiscall MPEGSequenceHeader::MPEGSequenceHeader(MPEGSequenceHeader *this,int bufferSize)

{
  MPEGRawDataHeader::MPEGRawDataHeader(&this->super_MPEGRawDataHeader,bufferSize);
  (this->super_MPEGRawDataHeader).super_MPEGHeader._vptr_MPEGHeader =
       (_func_int **)&PTR__MPEGRawDataHeader_0024bfb8;
  this->bit_rate = 0;
  this->rc_buffer_size = 0;
  *(undefined4 *)&(this->super_MPEGRawDataHeader).field_0x1c = 0;
  this->aspect_ratio_info = '\0';
  this->frame_rate_index = '\0';
  *(ushort *)&this->field_0x2c = *(ushort *)&this->field_0x2c & 0xf800;
  memset(&this->load_intra_matrix,0,0x82);
  this->progressive_sequence = '\0';
  this->chroma_format = '\0';
  this->horiz_size_ext = '\0';
  this->vert_size_ext = '\0';
  this->vert_size_ext = '\0';
  this->bit_rate_ext = 0;
  this->low_delay = false;
  this->pan_scan_height = 0;
  (this->frame_rate_ext).num = 0;
  (this->frame_rate_ext).den = 0;
  this->video_format = '\0';
  this->color_primaries = '\0';
  this->transfer_characteristics = '\0';
  this->matrix_coefficients = '\0';
  this->pan_scan_width = 0;
  this->profile = -1;
  this->level = -1;
  return;
}

Assistant:

MPEGSequenceHeader::MPEGSequenceHeader(const int bufferSize)
    : MPEGRawDataHeader(bufferSize),
      width(0),
      height(0),
      aspect_ratio_info(0),
      frame_rate_index(0),
      bit_rate(0),
      rc_buffer_size(0),
      vbv_buffer_size(0),
      constParameterFlag(0),
      load_intra_matrix(false),
      load_non_intra_matrix(false),
      intra_matrix(),
      non_intra_matrix(),
      chroma_format(0),
      horiz_size_ext(0),
      vert_size_ext(0),
      bit_rate_ext(0),
      low_delay(false),
      video_format(0),
      color_primaries(0),
      transfer_characteristics(0),
      matrix_coefficients(0),
      pan_scan_width(0),
      pan_scan_height(0)
{
    progressive_sequence = false;
    profile = -1;
    level = -1;
}